

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::addField(DataDictionary *this,int field)

{
  int local_14;
  DataDictionary *pDStack_10;
  int field_local;
  DataDictionary *this_local;
  
  local_14 = field;
  pDStack_10 = this;
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)(this + 0xf8),&local_14);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)(this + 0x128),&local_14);
  return;
}

Assistant:

void addField(int field) {
    m_fields.insert(field);
    m_orderedFields.push_back(field);
  }